

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

ssize_t hd_inflate_read_huff
                  (nghttp2_hd_inflater *inflater,nghttp2_buf *buf,uint8_t *in,uint8_t *last)

{
  int iVar1;
  bool bVar2;
  uint local_3c;
  int fin;
  ssize_t readlen;
  uint8_t *last_local;
  uint8_t *in_local;
  nghttp2_buf *buf_local;
  nghttp2_hd_inflater *inflater_local;
  
  bVar2 = inflater->left <= (ulong)((long)last - (long)in);
  readlen = (ssize_t)last;
  if (bVar2) {
    readlen = (ssize_t)(in + inflater->left);
  }
  local_3c = (uint)bVar2;
  inflater_local =
       (nghttp2_hd_inflater *)
       nghttp2_hd_huff_decode(&inflater->huff_decode_ctx,buf,in,readlen - (long)in,local_3c);
  if (-1 < (long)inflater_local) {
    iVar1 = nghttp2_hd_huff_decode_failure_state(&inflater->huff_decode_ctx);
    if (iVar1 == 0) {
      inflater->left = inflater->left - (long)inflater_local;
    }
    else {
      inflater_local = (nghttp2_hd_inflater *)0xfffffffffffffdf5;
    }
  }
  return (ssize_t)inflater_local;
}

Assistant:

static ssize_t hd_inflate_read_huff(nghttp2_hd_inflater *inflater,
                                    nghttp2_buf *buf, const uint8_t *in,
                                    const uint8_t *last) {
  ssize_t readlen;
  int fin = 0;
  if ((size_t)(last - in) >= inflater->left) {
    last = in + inflater->left;
    fin = 1;
  }
  readlen = nghttp2_hd_huff_decode(&inflater->huff_decode_ctx, buf, in,
                                   (size_t)(last - in), fin);

  if (readlen < 0) {
    DEBUGF("inflatehd: huffman decoding failed\n");
    return readlen;
  }
  if (nghttp2_hd_huff_decode_failure_state(&inflater->huff_decode_ctx)) {
    DEBUGF("inflatehd: huffman decoding failed\n");
    return NGHTTP2_ERR_HEADER_COMP;
  }

  inflater->left -= (size_t)readlen;
  return readlen;
}